

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable-file-dialogs.h
# Opt level: O3

void __thiscall
pfd::internal::executor::start_process
          (executor *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  __pid_t _Var4;
  uint uVar5;
  pointer pbVar6;
  int out [2];
  int in [2];
  vector<char_*,_std::allocator<char_*>_> args;
  int local_60 [4];
  char *local_50;
  vector<char_*,_std::allocator<char_*>_> local_48;
  
  do {
    bVar2 = ready(this,0x14);
  } while (!bVar2);
  (this->m_stdout)._M_string_length = 0;
  *(this->m_stdout)._M_dataplus._M_p = '\0';
  this->m_exit_code = -1;
  iVar3 = pipe(local_60 + 2);
  if (iVar3 == 0) {
    iVar3 = pipe(local_60);
    if (iVar3 == 0) {
      _Var4 = fork();
      this->m_pid = _Var4;
      if (-1 < _Var4) {
        close(local_60[(ulong)(_Var4 == 0) + 2]);
        close(local_60[this->m_pid != 0]);
        if (this->m_pid == 0) {
          dup2(local_60[2],0);
          dup2(local_60[1],1);
          iVar3 = open("/dev/null",1);
          dup2(iVar3,2);
          close(iVar3);
          local_48.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start = (char **)0x0;
          local_48.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pbVar6 = (command->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = (command->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (pbVar6 != pbVar1) {
            do {
              local_50 = (pbVar6->_M_dataplus)._M_p;
              std::vector<char*,std::allocator<char*>>::emplace_back<char*>
                        ((vector<char*,std::allocator<char*>> *)&local_48,&local_50);
              pbVar6 = pbVar6 + 1;
            } while (pbVar6 != pbVar1);
          }
          local_50 = (char *)0x0;
          std::vector<char_*,_std::allocator<char_*>_>::push_back(&local_48,&local_50);
          execvp(*local_48.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
                 local_48.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
          exit(1);
        }
        close(local_60[3]);
        this->m_fd = local_60[0];
        uVar5 = fcntl(local_60[0],3);
        fcntl(this->m_fd,4,(ulong)(uVar5 | 0x800));
        this->m_running = true;
      }
    }
  }
  return;
}

Assistant:

inline void internal::executor::start_process(std::vector<std::string> const &command)
{
    stop();
    m_stdout.clear();
    m_exit_code = -1;

    int in[2], out[2];
    if (pipe(in) != 0 || pipe(out) != 0)
        return;

    m_pid = fork();
    if (m_pid < 0)
        return;

    close(in[m_pid ? 0 : 1]);
    close(out[m_pid ? 1 : 0]);

    if (m_pid == 0)
    {
        dup2(in[0], STDIN_FILENO);
        dup2(out[1], STDOUT_FILENO);

        // Ignore stderr so that it doesn’t pollute the console (e.g. GTK+ errors from zenity)
        int fd = open("/dev/null", O_WRONLY);
        dup2(fd, STDERR_FILENO);
        close(fd);

        std::vector<char *> args;
        std::transform(command.cbegin(), command.cend(), std::back_inserter(args),
                       [](std::string const &s) { return const_cast<char *>(s.c_str()); });
        args.push_back(nullptr); // null-terminate argv[]

        execvp(args[0], args.data());
        exit(1);
    }

    close(in[1]);
    m_fd = out[0];
    auto flags = fcntl(m_fd, F_GETFL);
    fcntl(m_fd, F_SETFL, flags | O_NONBLOCK);

    m_running = true;
}